

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O0

bool __thiscall AABox::intersect(AABox *this,Ray *r)

{
  double dVar1;
  bool local_29;
  float local_20;
  float local_1c;
  float tmax;
  float tmin;
  Ray *r_local;
  AABox *this_local;
  
  if (*(float *)(r + 0xc) <= 0.0) {
    local_1c = (this->x2 - *(float *)r) / *(float *)(r + 0xc);
    local_20 = (this->x1 - *(float *)r) / *(float *)(r + 0xc);
  }
  else {
    local_1c = (this->x1 - *(float *)r) / *(float *)(r + 0xc);
    local_20 = (this->x2 - *(float *)r) / *(float *)(r + 0xc);
  }
  if (*(float *)(r + 0x10) <= 0.0) {
    dVar1 = std::fmax((double)(ulong)(uint)local_1c,
                      (double)(ulong)(uint)((this->y2 - *(float *)(r + 4)) / *(float *)(r + 0x10)));
    local_1c = SUB84(dVar1,0);
    dVar1 = std::fmin((double)(ulong)(uint)local_20,
                      (double)(ulong)(uint)((this->y1 - *(float *)(r + 4)) / *(float *)(r + 0x10)));
    local_20 = SUB84(dVar1,0);
  }
  else {
    dVar1 = std::fmax((double)(ulong)(uint)local_1c,
                      (double)(ulong)(uint)((this->y1 - *(float *)(r + 4)) / *(float *)(r + 0x10)));
    local_1c = SUB84(dVar1,0);
    dVar1 = std::fmin((double)(ulong)(uint)local_20,
                      (double)(ulong)(uint)((this->y2 - *(float *)(r + 4)) / *(float *)(r + 0x10)));
    local_20 = SUB84(dVar1,0);
  }
  if (*(float *)(r + 0x14) <= 0.0) {
    dVar1 = std::fmax((double)(ulong)(uint)local_1c,
                      (double)(ulong)(uint)((this->z2 - *(float *)(r + 8)) / *(float *)(r + 0x14)));
    local_1c = SUB84(dVar1,0);
    dVar1 = std::fmin((double)(ulong)(uint)local_20,
                      (double)(ulong)(uint)((this->z1 - *(float *)(r + 8)) / *(float *)(r + 0x14)));
    local_20 = SUB84(dVar1,0);
  }
  else {
    dVar1 = std::fmax((double)(ulong)(uint)local_1c,
                      (double)(ulong)(uint)((this->z1 - *(float *)(r + 8)) / *(float *)(r + 0x14)));
    local_1c = SUB84(dVar1,0);
    dVar1 = std::fmin((double)(ulong)(uint)local_20,
                      (double)(ulong)(uint)((this->z2 - *(float *)(r + 8)) / *(float *)(r + 0x14)));
    local_20 = SUB84(dVar1,0);
  }
  local_29 = local_1c <= local_20 && 0.0 < local_20;
  return local_29;
}

Assistant:

bool intersect(const Ray& r)
	{
		float tmin, tmax;
		if (r.dir.x > 0)
			tmin = (x1 - r.origin.x) / r.dir.x,
			tmax = (x2 - r.origin.x) / r.dir.x;
		else
			tmin = (x2 - r.origin.x) / r.dir.x,
			tmax = (x1 - r.origin.x) / r.dir.x;
		if (r.dir.y > 0)
			tmin = fmax(tmin, (y1 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y2 - r.origin.y) / r.dir.y);
		else
			tmin = fmax(tmin, (y2 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y1 - r.origin.y) / r.dir.y);
		if (r.dir.z > 0)
			tmin = fmax(tmin, (z1 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z2 - r.origin.z) / r.dir.z);
		else
			tmin = fmax(tmin, (z2 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z1 - r.origin.z) / r.dir.z);
		return tmin <= tmax && tmax > 0;
	}